

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt__rasterize(nk_tt__bitmap *result,nk_tt__point *pts,int *wcount,int windings,float scale_x
                     ,float scale_y,float shift_x,float shift_y,int off_x,int off_y,int invert,
                     nk_allocator *alloc)

{
  int iVar1;
  nk_tt__edge *p_00;
  float local_74;
  int local_70;
  int local_6c;
  int b;
  int a;
  nk_tt__point *p;
  int vsubsample;
  int m;
  int k;
  int j;
  int i;
  int n;
  nk_tt__edge *e;
  float y_scale_inv;
  int off_y_local;
  int off_x_local;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  int windings_local;
  int *wcount_local;
  nk_tt__point *pts_local;
  nk_tt__bitmap *result_local;
  
  local_74 = scale_y;
  if (invert != 0) {
    local_74 = -scale_y;
  }
  j = 0;
  for (k = 0; k < windings; k = k + 1) {
    j = wcount[k] + j;
  }
  p_00 = (nk_tt__edge *)(*alloc->alloc)(alloc->userdata,(void *)0x0,(long)(j + 1) * 0x14);
  if (p_00 != (nk_tt__edge *)0x0) {
    j = 0;
    p._4_4_ = 0;
    for (k = 0; k < windings; k = k + 1) {
      iVar1 = wcount[k];
      m = wcount[k] + -1;
      for (vsubsample = 0; vsubsample < wcount[k]; vsubsample = vsubsample + 1) {
        local_6c = vsubsample;
        local_70 = m;
        if ((pts[(long)p._4_4_ + (long)m].y != pts[(long)p._4_4_ + (long)vsubsample].y) ||
           (NAN(pts[(long)p._4_4_ + (long)m].y) || NAN(pts[(long)p._4_4_ + (long)vsubsample].y))) {
          p_00[j].invert = 0;
          if (invert == 0) {
            if (pts[(long)p._4_4_ + (long)m].y < pts[(long)p._4_4_ + (long)vsubsample].y)
            goto LAB_00153898;
          }
          else if (pts[(long)p._4_4_ + (long)vsubsample].y <= pts[(long)p._4_4_ + (long)m].y &&
                   pts[(long)p._4_4_ + (long)m].y != pts[(long)p._4_4_ + (long)vsubsample].y) {
LAB_00153898:
            p_00[j].invert = 1;
            local_6c = m;
            local_70 = vsubsample;
          }
          p_00[j].x0 = pts[(long)p._4_4_ + (long)local_6c].x * scale_x + shift_x;
          p_00[j].y0 = (pts[(long)p._4_4_ + (long)local_6c].y * local_74 + shift_y) * 1.0;
          p_00[j].x1 = pts[(long)p._4_4_ + (long)local_70].x * scale_x + shift_x;
          p_00[j].y1 = (pts[(long)p._4_4_ + (long)local_70].y * local_74 + shift_y) * 1.0;
          j = j + 1;
        }
        m = vsubsample;
      }
      p._4_4_ = iVar1 + p._4_4_;
    }
    nk_tt__sort_edges(p_00,j);
    nk_tt__rasterize_sorted_edges(result,p_00,j,1,off_x,off_y,alloc);
    (*alloc->free)(alloc->userdata,p_00);
  }
  return;
}

Assistant:

NK_INTERN void
nk_tt__rasterize(struct nk_tt__bitmap *result, struct nk_tt__point *pts,
    int *wcount, int windings, float scale_x, float scale_y,
    float shift_x, float shift_y, int off_x, int off_y, int invert,
    struct nk_allocator *alloc)
{
    float y_scale_inv = invert ? -scale_y : scale_y;
    struct nk_tt__edge *e;
    int n,i,j,k,m;
    int vsubsample = 1;
    /* vsubsample should divide 255 evenly; otherwise we won't reach full opacity */

    /* now we have to blow out the windings into explicit edge lists */
    n = 0;
    for (i=0; i < windings; ++i)
        n += wcount[i];

    e = (struct nk_tt__edge*)
       alloc->alloc(alloc->userdata, 0,(sizeof(*e) * (nk_size)(n+1)));
    if (e == 0) return;
    n = 0;

    m=0;
    for (i=0; i < windings; ++i)
    {
        struct nk_tt__point *p = pts + m;
        m += wcount[i];
        j = wcount[i]-1;
        for (k=0; k < wcount[i]; j=k++) {
            int a=k,b=j;
            /* skip the edge if horizontal */
            if (p[j].y == p[k].y)
                continue;

            /* add edge from j to k to the list */
            e[n].invert = 0;
            if (invert ? p[j].y > p[k].y : p[j].y < p[k].y) {
                e[n].invert = 1;
                a=j,b=k;
            }
            e[n].x0 = p[a].x * scale_x + shift_x;
            e[n].y0 = (p[a].y * y_scale_inv + shift_y) * (float)vsubsample;
            e[n].x1 = p[b].x * scale_x + shift_x;
            e[n].y1 = (p[b].y * y_scale_inv + shift_y) * (float)vsubsample;
            ++n;
        }
    }

    /* now sort the edges by their highest point (should snap to integer, and then by x) */
    /*STBTT_sort(e, n, sizeof(e[0]), stbtt__edge_compare); */
    nk_tt__sort_edges(e, n);
    /* now, traverse the scanlines and find the intersections on each scanline, use xor winding rule */
    nk_tt__rasterize_sorted_edges(result, e, n, vsubsample, off_x, off_y, alloc);
    alloc->free(alloc->userdata, e);
}